

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

FileBufSlot * read_jpeg_file(FileReader data)

{
  FileBufSlot *pFVar1;
  char *pcVar2;
  FileBufSlot *slot;
  MppBuffer hw_buf;
  size_t buf_size;
  size_t read_size;
  FILE *fp;
  FileReaderImpl *impl;
  FileReader data_local;
  
  read_size = *data;
  buf_size = 0;
  hw_buf = *(MppBuffer *)((long)data + 8);
  slot = (FileBufSlot *)0x0;
  fp = (FILE *)data;
  impl = (FileReaderImpl *)data;
  pFVar1 = (FileBufSlot *)mpp_osal_calloc("read_jpeg_file",0x28);
  mpp_buffer_get_with_tag
            (fp->_IO_backup_base,&slot,fp->_IO_read_ptr,"mpi_dec_utils","read_jpeg_file");
  if ((slot == (FileBufSlot *)0x0) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"hw_buf","read_jpeg_file",0x9c
                ), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pcVar2 = (char *)mpp_buffer_get_ptr_with_caller(slot,"read_jpeg_file");
  pFVar1->data = pcVar2;
  if ((pFVar1->data == (char *)0x0) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"slot->data","read_jpeg_file",
                 0x9f), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  buf_size = fread(pFVar1->data,1,(size_t)hw_buf,(FILE *)read_size);
  if (((MppBuffer)buf_size != hw_buf) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"read_size == buf_size",
                 "read_jpeg_file",0xa2), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  fp->_IO_buf_end = fp->_IO_buf_end + buf_size;
  fp->_IO_save_base = (char *)buf_size;
  pFVar1->buf = slot;
  pFVar1->size = buf_size;
  pFVar1->eos = 1;
  return pFVar1;
}

Assistant:

static FileBufSlot *read_jpeg_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    FILE *fp = impl->fp_input;
    size_t read_size = 0;
    size_t buf_size = impl->file_size;
    MppBuffer hw_buf = NULL;
    FileBufSlot *slot = mpp_calloc(FileBufSlot, 1);

    mpp_buffer_get(impl->group, &hw_buf, impl->file_size);
    mpp_assert(hw_buf);

    slot->data = mpp_buffer_get_ptr(hw_buf);
    mpp_assert(slot->data);
    read_size = fread(slot->data, 1, buf_size, fp);

    mpp_assert(read_size == buf_size);

    impl->read_total += read_size;
    impl->read_size = read_size;

    slot->buf   = hw_buf;
    slot->size  = read_size;
    slot->eos   = 1;

    return slot;
}